

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen8TextureCalc::FillTex2D
          (GmmGen8TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  GMM_TILE_INFO *pGVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  GMM_RESOURCE_TYPE GVar7;
  anon_struct_8_45_9b07292e_for_Gpu aVar8;
  GmmTextureCalc *pGVar9;
  GMM_PLATFORM_INFO *pGVar10;
  uint8_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int iVar14;
  GMM_STATUS GVar15;
  uint uVar16;
  long lVar17;
  uint32_t uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint32_t NumSamples;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint32_t local_88;
  uint32_t local_84;
  uint32_t CompressDepth;
  uint32_t ColFactor;
  uint32_t RowFactor;
  GMM_PLATFORM_INFO *local_70;
  uint local_68;
  uint local_64;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint32_t local_40;
  uint32_t local_3c;
  uint local_38;
  uint8_t local_31;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  local_70 = GmmGetPlatformInfo((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext
                               );
  GVar7 = pTexInfo->Type;
  ColFactor = pTexInfo->BitsPerPixel;
  local_3c = pTexInfo->BaseHeight;
  local_38 = (uint)pTexInfo->BaseWidth;
  uVar18 = (pTexInfo->MSAA).NumSamples;
  uVar18 = uVar18 + (uVar18 == 0);
  (pTexInfo->MSAA).NumSamples = uVar18;
  uVar19 = pTexInfo->ArraySize;
  aVar8 = (pTexInfo->Flags).Gpu;
  uVar13 = 1;
  if (((ulong)aVar8 & 0x20000040) == 0) {
    uVar13 = uVar18;
  }
  uVar16 = uVar13 * ((uint)(GVar7 == RESOURCE_CUBE) * 5 + 1) * (uVar19 + (uVar19 == 0));
  uVar22 = uVar16;
  if ((((ulong)aVar8 & 0x18) != 0) &&
     (((uVar16 != uVar19 || 2 < uVar16 ||
       ((3 < pTexInfo->Format - GMM_FORMAT_B8G8R8A8_UNORM &&
        (1 < pTexInfo->Format - GMM_FORMAT_R8G8B8A8_UNORM)))) ||
      ((uVar22 = 4, ((byte)(((ulong)aVar8 & 0xffffffff) >> 3) & 0x1f & (local_38 & 0xf) == 0) == 0
       && ((((ulong)aVar8 & 0x10) == 0 || (local_38 % 0xc != 0)))))))) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar8 & 0xffffffffffffffe7);
    uVar22 = uVar16;
  }
  local_40 = (pTexInfo->Alignment).HAlign;
  uVar18 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            ((GmmTextureCalc *)this,pTexInfo->Format,&local_64,&local_68,&local_88);
  local_31 = GmmIsCompressed((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext,
                             pTexInfo->Format);
  uVar13 = local_3c;
  _RowFactor = (GmmTextureCalc *)this;
  _CompressHeight = pRestrictions;
  if (uVar22 < 2) {
    (pTexInfo->Alignment).QPitch = 0;
    local_58 = (*(this->super_GmmGen7TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[6])
                         (this,pTexInfo);
  }
  else {
    NumSamples = 1;
    uVar12 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar12 = (pTexInfo->MSAA).NumSamples;
    }
    local_58 = uVar22;
    uVar12 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,local_3c,uVar18,uVar12);
    this = (GmmGen8TextureCalc *)_RowFactor;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      NumSamples = (pTexInfo->MSAA).NumSamples;
    }
    uVar13 = GmmTextureCalc::ExpandHeight(_RowFactor,uVar13 >> 1,uVar18,NumSamples);
    uVar19 = uVar12 + uVar18 * 0xc + uVar13;
    if (pTexInfo->MaxLod == 0) {
      uVar19 = uVar12;
    }
    uVar20 = (ulong)uVar19;
    uVar6 = *(ushort *)&(pTexInfo->Flags).Wa;
    uVar22 = uVar6 & 0x20;
    if ((uVar6 & 0x20) != 0) {
      uVar22 = uVar12;
    }
    uVar22 = uVar19 - uVar22;
    aVar8 = (pTexInfo->Flags).Gpu;
    if (((aVar8._0_4_ >> 0x19 & 1) != 0) &&
       (((uint)(((GmmTextureCalc *)this)->pGmmLibContext->SkuTable).field_5 & 2) != 0)) {
      uVar18 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      uVar22 = -uVar18 & (uVar22 - 1) + uVar18;
    }
    if (((local_31 != '\0') && ((local_68 & 3) != 0)) &&
       (uVar16 = local_68 << ((byte)local_68 & 1) + 1, uVar16 != 0)) {
      uVar22 = (uVar16 - 1) + uVar22;
      uVar22 = uVar22 - uVar22 % uVar16;
      uVar19 = (uVar16 - 1) + uVar19;
      uVar20 = (ulong)(uVar19 - uVar19 % uVar16);
    }
    iVar14 = (int)uVar20;
    (pTexInfo->Alignment).QPitch = uVar22;
    if (local_31 == '\0') {
      if ((aVar8._0_4_ >> 0x1d & 1) == 0) {
        if (((ulong)aVar8 & 2) != 0) {
          if (((ulong)aVar8 >> 0x29 & 1) == 0) {
            uVar22 = uVar22 >> ((byte)((ulong)aVar8 >> 0x26) & 4);
          }
          else {
            uVar22 = uVar22 >> 5;
          }
        }
      }
      else {
        uVar22 = uVar22 >> 1;
      }
    }
    else {
      uVar22 = uVar22 / local_68;
      iVar14 = (int)(uVar20 / local_68);
    }
    uVar19 = iVar14 - uVar22;
    if ((uVar6 & 0x20) == 0) {
      uVar19 = uVar6 & 0x20;
    }
    local_58 = local_58 * uVar22 + uVar19;
    pRestrictions = _CompressHeight;
  }
  uVar19 = local_38;
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar18 = 1;
  }
  else {
    uVar18 = (pTexInfo->MSAA).NumSamples;
  }
  uVar18 = GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,local_38,local_40,uVar18);
  uVar22 = uVar18;
  if (1 < pTexInfo->MaxLod) {
    uVar12 = 1;
    uVar13 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar13 = (pTexInfo->MSAA).NumSamples;
    }
    local_3c = GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,uVar19 >> 1,local_40,uVar13);
    pGVar9 = _RowFactor;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar12 = (pTexInfo->MSAA).NumSamples;
    }
    uVar13 = GmmTextureCalc::ExpandWidth(_RowFactor,local_38 >> 2,local_40,uVar12);
    if (((((pGVar9->pGmmLibContext->WaTable).field_0x8 & 0x20) != 0) ||
        (((uint)(pTexInfo->Flags).Wa & 0x20) != 0)) &&
       ((((uint)local_70->FormatTable[pTexInfo->Format].field_0 & 1) != 0 && (local_64 == 5)))) {
      uVar12 = uVar13 + 0xf;
      if ((uVar19 >> 1) % 10 - 1 < 5) {
        uVar13 = uVar12;
      }
      if (local_38 == 1) {
        uVar13 = uVar12;
      }
    }
    this = (GmmGen8TextureCalc *)_RowFactor;
    pRestrictions = _CompressHeight;
    uVar22 = uVar13 + local_3c;
    if (uVar13 + local_3c < uVar18) {
      uVar22 = uVar18;
    }
  }
  pGVar10 = local_70;
  if (local_31 != '\0') {
    uVar22 = uVar22 / local_64;
    goto LAB_001b19d5;
  }
  aVar8 = (pTexInfo->Flags).Gpu;
  if ((aVar8._0_4_ >> 0x1d & 1) != 0) {
    uVar22 = uVar22 * 2;
    goto LAB_001b19d5;
  }
  if (((ulong)aVar8 & 2) == 0) {
    if (((ulong)aVar8 & 8) == 0) {
      if (((ulong)aVar8 & 0x10) != 0) {
        uVar22 = (uVar22 * pTexInfo->ArraySize) / 3;
      }
      goto LAB_001b19d5;
    }
    uVar22 = uVar22 * pTexInfo->ArraySize;
  }
  else if (((ulong)aVar8 >> 0x29 & 1) == 0) {
    if (((ulong)aVar8 >> 0x28 & 1) == 0) goto LAB_001b19d5;
    uVar18 = pTexInfo->BitsPerPixel;
    if (uVar18 != 0x80) {
      if (uVar18 != 0x40) {
        if (uVar18 == 0x20) {
          uVar22 = uVar22 >> 4;
        }
        goto LAB_001b19d5;
      }
LAB_001b19c6:
      uVar22 = uVar22 >> 3;
      goto LAB_001b19d5;
    }
  }
  else {
    uVar18 = pTexInfo->BitsPerPixel;
    if (uVar18 == 0x80) {
      uVar22 = uVar22 >> 1;
      goto LAB_001b19d5;
    }
    if (uVar18 != 0x40) {
      if (uVar18 != 0x20) goto LAB_001b19d5;
      goto LAB_001b19c6;
    }
  }
  uVar22 = uVar22 >> 2;
LAB_001b19d5:
  uVar19 = uVar22 * ColFactor >> 3;
  if (uVar19 <= pRestrictions->MinPitch) {
    uVar19 = pRestrictions->MinPitch;
  }
  uVar19 = -pRestrictions->PitchAlignment & (pRestrictions->PitchAlignment - 1) + uVar19;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_54 = local_58;
  if (local_70->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    uVar2 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar4 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    uStack_54 = local_58 + uVar4 + -1;
    local_58 = -uVar2 & uVar19 + uVar2 + -1;
    uStack_54 = -uVar4 & uStack_54;
    uStack_50 = 0;
    uStack_4c = 0;
    uVar19 = local_58;
    if (((((pTexInfo->Flags).Gpu.field_0x4 & 8) != 0) ||
        (((pTexInfo->Flags).Info.field_0x3 & 8) != 0)) &&
       (((pTexInfo->Flags).Info.field_0x4 & 0x10) != 0)) {
      local_84 = 0;
      CompressDepth = 0;
      GmmTextureCalc::GmmGetD3DToHwTileConversion
                ((GmmTextureCalc *)this,pTexInfo,&local_84,&CompressDepth);
      auVar23._4_4_ = CompressDepth;
      auVar23._0_4_ = local_84;
      auVar23._8_8_ = 0;
      pGVar1 = pGVar10->TileInfo + pTexInfo->TileMode;
      uVar3 = pGVar1->LogicalTileWidth;
      uVar5 = pGVar1->LogicalTileHeight;
      auVar24._4_4_ = uVar5;
      auVar24._0_4_ = uVar3;
      auVar24._8_8_ = 0;
      auVar23 = pmulld(auVar23,auVar24);
      uStack_54 = uStack_54 + auVar23._4_4_ + -1 & -auVar23._4_4_;
      uStack_50 = uStack_50 + auVar23._8_4_ + -1 & -auVar23._8_4_;
      uStack_4c = uStack_4c + auVar23._12_4_ + -1 & -auVar23._12_4_;
      pRestrictions = _CompressHeight;
      uVar19 = local_58 + auVar23._0_4_ + -1 & -auVar23._0_4_;
    }
  }
  local_58 = uVar19;
  (pTexInfo->Flags).Info =
       (anon_struct_8_44_94931171_for_Info)
       ((ulong)(pTexInfo->Flags).Info & 0xfffffffffffd7fff | 0x8000);
  uVar11 = GmmIsYUVPacked(pTexInfo->Format);
  if (((uVar11 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
     (uVar19 = uStack_54, pTexInfo->BitsPerPixel == 0x30)) {
    if (local_58 == 0) {
      iVar14 = 0x11;
    }
    else {
      iVar14 = (local_58 + 0xf) / local_58 + 1;
    }
    uVar19 = uStack_54 + iVar14;
  }
  GVar15 = GmmTextureCalc::FillTexPitchAndSize
                     ((GmmTextureCalc *)this,pTexInfo,(ulong)local_58,uVar19 + 1 & 0xfffffffe,
                      pRestrictions);
  if (GVar15 == GMM_SUCCESS) {
    (*((GmmTextureCalc *)this)->_vptr_GmmTextureCalc[7])(this);
    (pTexInfo->Alignment).PackedMipStartLod = 0xf;
  }
  if (((uint)(pTexInfo->Flags).Wa & 0x20) != 0) {
    uVar20 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2];
    uVar21 = 0;
    lVar17 = uVar20 - uVar20 % ((ulong)pGVar10->TileInfo[pTexInfo->TileMode].LogicalTileHeight *
                               pTexInfo->Pitch);
    pTexInfo->Size = pTexInfo->Size - lVar17;
    uVar18 = pTexInfo->MaxLod;
    do {
      *(long *)(pTexInfo->MmcHint + uVar21 * 8 + 0x80) =
           *(long *)(pTexInfo->MmcHint + uVar21 * 8 + 0x80) - lVar17;
      uVar21 = uVar21 + 1;
    } while (uVar18 + 1 + (uint)(uVar18 == 0xffffffff) != uVar21);
  }
  return GVar15;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen8TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) * // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil) ?
     1 :
     pTexInfo->MSAA.NumSamples); // MSAA (non-Depth/Stencil) RT samples stored as array planes.

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = 0;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = 0;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    // Calculate Block Surface Height
    /////////////////////////////////

    if(ExpandedArraySize > 1)
    {
        uint32_t Height0, Height1, Mip0BlockHeight, Slice0Delta = 0;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);
        Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

        Mip0BlockHeight = BlockHeight = (pTexInfo->MaxLod > 0) ?
                                        Height0 + Height1 + 12 * VAlign :
                                        Height0;
        BlockHeight -= (pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) ? Height0 : 0;

        if(pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d)
        {
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }

        // QPitch for compressed surface must be multiple of BlockHeight and 4...
        if(Compress && (CompressHeight % 4))
        {
            uint32_t LCM    = CompressHeight * ((CompressHeight % 2) ? 4 : 2);
            BlockHeight     = GFX_ALIGN_NP2(BlockHeight, LCM);
            Mip0BlockHeight = GFX_ALIGN_NP2(Mip0BlockHeight, LCM);
        }

        // Gen8 QPitch programming refers to the logical view, not physical.
        pTexInfo->Alignment.QPitch = BlockHeight;

        if(Compress)
        {
            BlockHeight /= CompressHeight;
            Mip0BlockHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            BlockHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                BlockHeight /= 32;
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                BlockHeight /= 16;
            }
        }

        Slice0Delta = (pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) ? (Mip0BlockHeight - BlockHeight) : 0;
        BlockHeight *= ExpandedArraySize;
        BlockHeight += Slice0Delta;
    }
    else
    {
        pTexInfo->Alignment.QPitch = 0;

        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }

    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths
    // are greater than LOD0. e.g. dimensions 4x4 and MinPitch == 1
    if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);
        
	if((pGmmLibContext->GetWaTable().WaAstcCorruptionForOddCompressedBlockSizeX || pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) && pPlatform->FormatTable[pTexInfo->Format].ASTC && CompressWidth == 5)
        {
            uint32_t Width1   = (Width == 1) ? 1 : (Width >> 1);
            uint32_t Modulo10 = Width1 % 10;
            if(Modulo10 >= 1 && Modulo10 <= CompressWidth)
            {
                AlignedWidthLod2 += 3 * CompressWidth;
            }
        }
        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth /= CompressWidth;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS)
    {
        if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    AlignedWidth /= 8;
                    break;
                case 64:
                    AlignedWidth /= 4;
                    break;
                case 128:
                    AlignedWidth /= 2;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }
        else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
        {
            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    AlignedWidth /= 16;
                    break;
                case 64:
                    AlignedWidth /= 8;
                    break;
                case 128:
                    AlignedWidth /= 4;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);

    ////////////////////
    // Adjust for Tiling
    ////////////////////
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // If Tiled Resource or Undefined64KBSwizzle resource, align to 64KB tile size
        if((pTexInfo->Flags.Gpu.TiledResource || pTexInfo->Flags.Info.Undefined64KBSwizzle) &&
           (pTexInfo->Flags.Info.TiledY))
        {
            uint32_t ColFactor = 0, RowFactor = 0;
            uint32_t TRTileWidth = 0, TRTileHeight = 0;

            GmmGetD3DToHwTileConversion(pTexInfo, &ColFactor, &RowFactor);
            TRTileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * ColFactor;
            TRTileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight * RowFactor;

            Pitch       = GFX_ALIGN(Pitch, TRTileWidth);
            BlockHeight = GFX_ALIGN(BlockHeight, TRTileHeight);
        }
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over-fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);

        // Init to no-packed mips. It'll be initialized when app calls to get packed
        // mips. Calculate packed mips here if there's a chance apps won't call to
        // get packed mips.
        pTexInfo->Alignment.PackedMipStartLod = GMM_TILED_RESOURCE_NO_PACKED_MIPS;
    }

    if(pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips)
    {
        uint32_t i             = 0;
        uint64_t SkipMip0Tiles = 0;
        SkipMip0Tiles          = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[1] /
                        (pTexInfo->Pitch * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        SkipMip0Tiles *= pTexInfo->Pitch * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        pTexInfo->Size -= SkipMip0Tiles;
        for(i = 0; i <= pTexInfo->MaxLod; i++)
        {
            pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] -= SkipMip0Tiles;
        }
    }
    GMM_DPF_EXIT;

    return (Status);
}